

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-context.c
# Opt level: O3

wchar_t context_menu_command(wchar_t mx,wchar_t my)

{
  size_t sVar1;
  int iVar2;
  uint uVar3;
  menu_conflict *pmVar4;
  wchar_t wVar5;
  ulong uVar6;
  ulong uVar7;
  cmd_info_conflict *pcVar8;
  char cmd_name [80];
  byte local_a3;
  byte local_a2;
  undefined1 local_a1;
  wchar_t local_a0;
  wchar_t local_9c;
  size_t local_98;
  cmd_info_conflict *local_90;
  char local_88 [88];
  
  pmVar4 = menu_dynamic_new();
  if (pmVar4 == (menu_conflict *)0x0) {
    wVar5 = L'\0';
  }
  else {
    pmVar4->selections = "abcdefghijklmnopqrstuvwxyz";
    menu_dynamic_add(pmVar4,"Item",1);
    menu_dynamic_add(pmVar4,"Action",2);
    menu_dynamic_add(pmVar4,"Item Management",3);
    menu_dynamic_add(pmVar4,"Info",4);
    menu_dynamic_add(pmVar4,"Util",5);
    menu_dynamic_add(pmVar4,"Misc",6);
    menu_dynamic_calc_location(pmVar4,mx,my);
    screen_save();
    region_erase_bordered((region *)&pmVar4->boundary);
    wVar5 = L'\0';
    prt("(Enter to select, ESC) Command:",L'\0',L'\0');
    iVar2 = menu_dynamic_select(pmVar4);
    menu_dynamic_free(pmVar4);
    screen_load();
    if (0 < iVar2) {
      local_90 = cmds_all[iVar2 - 1U].list;
      sVar1 = cmds_all[iVar2 - 1U].len;
      uVar7 = (ulong)(player->opts).opt[1];
      local_9c = mx;
      pmVar4 = menu_dynamic_new();
      if (pmVar4 != (menu_conflict *)0x0) {
        pmVar4->selections = "abcdefghijklmnopqrstuvwxyz";
        local_a1 = 0;
        local_a0 = my;
        local_98 = sVar1;
        if (0 < (int)(uint)sVar1) {
          uVar6 = 0;
          pcVar8 = local_90;
          do {
            uVar3 = pcVar8->key[uVar7];
            local_a3 = (byte)uVar3;
            local_a2 = (0xffffffe4 < uVar3 - 0x1c) << 5 | local_a3 | 0x40;
            if (uVar3 < 0x20) {
              local_a3 = 0x5e;
            }
            else {
              local_a2 = 0;
            }
            strnfmt(local_88,0x50,"%s (%s)",pcVar8->desc,&local_a3);
            uVar6 = uVar6 + 1;
            menu_dynamic_add(pmVar4,local_88,(int)uVar6);
            pcVar8 = pcVar8 + 1;
          } while (((uint)sVar1 & 0x7fffffff) != uVar6);
        }
        menu_dynamic_calc_location(pmVar4,local_9c,local_a0);
        screen_save();
        region_erase_bordered((region *)&pmVar4->boundary);
        prt("(Enter to select, ESC) Command:",L'\0',L'\0');
        uVar3 = menu_dynamic_select(pmVar4);
        menu_dynamic_free(pmVar4);
        screen_load();
        if ((0 < (int)uVar3) && ((int)uVar3 <= (int)local_98)) {
          Term_keypress(local_90[uVar3].key[uVar7 - 0x14],'\0');
        }
      }
      wVar5 = L'\x01';
    }
  }
  return wVar5;
}

Assistant:

int context_menu_command(int mx, int my)
{
	struct menu *m;
	int selected;

	m = menu_dynamic_new();
	if (!m) {
		return 0;
	}

	m->selections = lower_case;
	menu_dynamic_add(m, "Item", 1);
	menu_dynamic_add(m, "Action", 2);
	menu_dynamic_add(m, "Item Management", 3);
	menu_dynamic_add(m, "Info", 4);
	menu_dynamic_add(m, "Util", 5);
	menu_dynamic_add(m, "Misc", 6);

	menu_dynamic_calc_location(m, mx, my);

	screen_save();
	region_erase_bordered(&m->boundary);

	prt("(Enter to select, ESC) Command:", 0, 0);
	selected = menu_dynamic_select(m);
	menu_dynamic_free(m);

	screen_load();

	/* XXX-AS this is gross, as is the way there's two ways to display the
	 * entire command list.  Fix me */
	if (selected > 0) {
		selected--;
		show_command_list(cmds_all[selected].list, cmds_all[selected].len,
						  mx, my);
	} else {
		return 0;
	}

	return 1;
}